

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O2

Expression * __thiscall
slang::ast::builtins::DumpVarsTask::bindArgument
          (DumpVarsTask *this,size_t argIndex,ASTContext *context,ExpressionSyntax *syntax,
          Args *args)

{
  bool bVar1;
  SymbolKind SVar2;
  Compilation *this_00;
  Compilation *compilation;
  InvalidExpression *pIVar3;
  HierarchicalReferenceExpression *pHVar4;
  Symbol *this_01;
  VariableSymbol *pVVar5;
  Diagnostic *this_02;
  Expression *pEVar6;
  InstanceSymbol *this_03;
  Scope *this_04;
  bitmask<slang::ast::LookupFlags> extraLookupFlags;
  SourceRange sourceRange;
  InvalidExpression *local_28;
  
  extraLookupFlags.m_bits = (underlying_type)args;
  if (argIndex == 0) {
    pEVar6 = SystemSubroutine::bindArgument((SystemSubroutine *)this,0,context,syntax,args);
    return pEVar6;
  }
  this_00 = ASTContext::getCompilation(context);
  bVar1 = slang::syntax::NameSyntax::isKind((syntax->super_SyntaxNode).kind);
  if (!bVar1) {
    sourceRange = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
    ASTContext::addDiag(context,(DiagCode)0xa000b,sourceRange);
    local_28 = (InvalidExpression *)0x0;
    pIVar3 = BumpAllocator::
             emplace<slang::ast::InvalidExpression,decltype(nullptr),slang::ast::Type_const&>
                       (&this_00->super_BumpAllocator,&local_28,this_00->errorType);
    return &pIVar3->super_Expression;
  }
  compilation = (Compilation *)
                slang::syntax::SyntaxNode::as<slang::syntax::NameSyntax>(&syntax->super_SyntaxNode);
  pIVar3 = (InvalidExpression *)
           HierarchicalReferenceExpression::fromSyntax
                     ((HierarchicalReferenceExpression *)this_00,compilation,(NameSyntax *)context,
                      (ASTContext *)0x0,extraLookupFlags);
  if ((pIVar3->super_Expression).kind != HierarchicalReference) {
    return &pIVar3->super_Expression;
  }
  pHVar4 = Expression::as<slang::ast::HierarchicalReferenceExpression>((Expression *)pIVar3);
  this_01 = not_null<const_slang::ast::Symbol_*>::get(&pHVar4->symbol);
  SVar2 = this_01->kind;
  if (SVar2 - Net < 2) {
LAB_002fd259:
    if (((SVar2 - Variable < 0x19) && ((0x1800c0fU >> (SVar2 - Variable & 0x1f) & 1) != 0)) &&
       (pVVar5 = Symbol::as<slang::ast::VariableSymbol>(this_01), pVVar5->lifetime == Automatic)) {
      this_02 = ASTContext::addDiag(context,(DiagCode)0x4000b,(pIVar3->super_Expression).sourceRange
                                   );
      Diagnostic::operator<<(this_02,this_01->name);
    }
  }
  else {
    if (SVar2 == Instance) {
      this_03 = Symbol::as<slang::ast::InstanceSymbol>(this_01);
      bVar1 = InstanceSymbol::isModule(this_03);
      if (bVar1) {
        SVar2 = this_01->kind;
        goto LAB_002fd259;
      }
    }
    this_04 = not_null<const_slang::ast::Scope_*>::get(&context->scope);
    bVar1 = Scope::isUninstantiated(this_04);
    if (!bVar1) {
      ASTContext::addDiag(context,(DiagCode)0xa000b,(pIVar3->super_Expression).sourceRange);
    }
    local_28 = pIVar3;
    pIVar3 = BumpAllocator::
             emplace<slang::ast::InvalidExpression,slang::ast::Expression*,slang::ast::Type_const&>
                       (&this_00->super_BumpAllocator,(Expression **)&local_28,this_00->errorType);
  }
  return &pIVar3->super_Expression;
}

Assistant:

const Expression& bindArgument(size_t argIndex, const ASTContext& context,
                                   const ExpressionSyntax& syntax, const Args& args) const final {
        if (argIndex > 0) {
            auto& comp = context.getCompilation();
            if (!NameSyntax::isKind(syntax.kind)) {
                context.addDiag(diag::ExpectedModOrVarName, syntax.sourceRange());
                return *comp.emplace<InvalidExpression>(nullptr, comp.getErrorType());
            }

            auto& ref = HierarchicalReferenceExpression::fromSyntax(comp, syntax.as<NameSyntax>(),
                                                                    context);

            if (ref.kind == ExpressionKind::HierarchicalReference) {
                auto& sym = *ref.as<HierarchicalReferenceExpression>().symbol;
                if (sym.kind != SymbolKind::Variable && sym.kind != SymbolKind::Net &&
                    (sym.kind != SymbolKind::Instance || !sym.as<InstanceSymbol>().isModule())) {
                    if (!context.scope->isUninstantiated())
                        context.addDiag(diag::ExpectedModOrVarName, ref.sourceRange);
                    return *comp.emplace<InvalidExpression>(&ref, comp.getErrorType());
                }
                else if (VariableSymbol::isKind(sym.kind) &&
                         sym.as<VariableSymbol>().lifetime == VariableLifetime::Automatic) {
                    context.addDiag(diag::AutoVarTraced, ref.sourceRange) << sym.name;
                }
            }

            return ref;
        }

        return SystemTaskBase::bindArgument(argIndex, context, syntax, args);
    }